

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charpoly.h
# Opt level: O1

void charpoly_danilevsky_piv<Eigen::Matrix<double,11,11,0,11,11>>
               (MatrixBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_> *A,double *p)

{
  undefined1 *puVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  Index size;
  MatrixBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_> *pMVar7;
  long lVar8;
  double *pdVar9;
  double *pdVar10;
  undefined8 *puVar11;
  DstEvaluatorType dstEvaluator;
  undefined1 *puVar12;
  char *__function;
  Index index;
  ulong uVar13;
  PointerType ptr;
  MatrixBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_> *pMVar14;
  ActualDstType actualDst;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  MatrixBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_> *pMVar18;
  ulong uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  double dVar22;
  undefined1 auVar23 [16];
  VectorXd v;
  VectorXd vinv;
  VectorXd Acol;
  double *local_f8;
  double dStack_f0;
  Transpose<Eigen::Matrix<double,_1,_11,_1,_1,_11>_> local_e8;
  ulong local_e0;
  Transpose<const_Eigen::Matrix<double,_11,_11,_0,_11,_11>_> local_d8;
  ulong local_d0;
  Matrix<double,_1,_11,_1,_1,_11> local_c8;
  double *local_70;
  ulong local_68;
  undefined1 *local_60;
  Scalar local_58;
  Transpose<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_50;
  double local_48;
  undefined8 uStack_40;
  
  pMVar18 = A + 0x50;
  uVar17 = 0xb;
  uVar15 = 9;
  uVar19 = 10;
  local_70 = p;
  do {
    puVar1 = (undefined1 *)(uVar17 - 2);
    pMVar14 = A + (long)puVar1 * 0x58;
    puVar12 = (undefined1 *)((ulong)puVar1 & 0xffffffff);
    if (2 < uVar17) {
      uVar20 = (undefined4)(*(ulong *)(pMVar14 + uVar19 * 8) & 0x7fffffffffffffff);
      uVar21 = (undefined4)((*(ulong *)(pMVar14 + uVar19 * 8) & 0x7fffffffffffffff) >> 0x20);
      uVar13 = 0;
      puVar12 = (undefined1 *)((ulong)puVar1 & 0xffffffff);
      pMVar7 = pMVar18;
      do {
        dVar22 = ABS(*(double *)pMVar7);
        bVar3 = dVar22 != (double)CONCAT44(uVar21,uVar20);
        bVar4 = (double)CONCAT44(uVar21,uVar20) <= dVar22;
        if (dVar22 <= (double)CONCAT44(uVar21,uVar20)) {
          dVar22 = (double)CONCAT44(uVar21,uVar20);
        }
        if (bVar4 && bVar3) {
          puVar12 = (undefined1 *)(uVar13 & 0xffffffff);
        }
        uVar13 = uVar13 + 1;
        pMVar7 = pMVar7 + 0x58;
        uVar20 = SUB84(dVar22,0);
        uVar21 = (undefined4)((ulong)dVar22 >> 0x20);
      } while (uVar15 != uVar13);
    }
    if (puVar1 != puVar12) {
      if (10 < (uint)puVar12) {
        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                      "Eigen::Block<Eigen::Matrix<double, 11, 11>, 1, 11>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, 11, 11>, BlockRows = 1, BlockCols = 11, InnerPanel = false]"
                     );
      }
      uVar2 = *(undefined8 *)(A + uVar17 * 8 + -0x10);
      *(undefined8 *)(A + uVar17 * 8 + -0x10) = *(undefined8 *)(A + (long)puVar12 * 8);
      *(undefined8 *)(A + (long)puVar12 * 8) = uVar2;
      uVar2 = *(undefined8 *)(A + uVar17 * 8 + 0x48);
      *(undefined8 *)(A + uVar17 * 8 + 0x48) = *(undefined8 *)(A + (long)puVar12 * 8 + 0x58);
      *(undefined8 *)(A + (long)puVar12 * 8 + 0x58) = uVar2;
      uVar2 = *(undefined8 *)(A + uVar17 * 8 + 0xa0);
      *(undefined8 *)(A + uVar17 * 8 + 0xa0) = *(undefined8 *)(A + (long)puVar12 * 8 + 0xb0);
      *(undefined8 *)(A + (long)puVar12 * 8 + 0xb0) = uVar2;
      uVar2 = *(undefined8 *)(A + uVar17 * 8 + 0xf8);
      *(undefined8 *)(A + uVar17 * 8 + 0xf8) = *(undefined8 *)(A + (long)puVar12 * 8 + 0x108);
      *(undefined8 *)(A + (long)puVar12 * 8 + 0x108) = uVar2;
      uVar2 = *(undefined8 *)(A + uVar17 * 8 + 0x150);
      *(undefined8 *)(A + uVar17 * 8 + 0x150) = *(undefined8 *)(A + (long)puVar12 * 8 + 0x160);
      *(undefined8 *)(A + (long)puVar12 * 8 + 0x160) = uVar2;
      uVar2 = *(undefined8 *)(A + uVar17 * 8 + 0x1a8);
      *(undefined8 *)(A + uVar17 * 8 + 0x1a8) = *(undefined8 *)(A + (long)puVar12 * 8 + 0x1b8);
      *(undefined8 *)(A + (long)puVar12 * 8 + 0x1b8) = uVar2;
      uVar2 = *(undefined8 *)(A + uVar17 * 8 + 0x200);
      *(undefined8 *)(A + uVar17 * 8 + 0x200) = *(undefined8 *)(A + (long)puVar12 * 8 + 0x210);
      *(undefined8 *)(A + (long)puVar12 * 8 + 0x210) = uVar2;
      uVar2 = *(undefined8 *)(A + uVar17 * 8 + 600);
      *(undefined8 *)(A + uVar17 * 8 + 600) = *(undefined8 *)(A + (long)puVar12 * 8 + 0x268);
      *(undefined8 *)(A + (long)puVar12 * 8 + 0x268) = uVar2;
      uVar2 = *(undefined8 *)(A + uVar17 * 8 + 0x2b0);
      *(undefined8 *)(A + uVar17 * 8 + 0x2b0) = *(undefined8 *)(A + (long)puVar12 * 8 + 0x2c0);
      *(undefined8 *)(A + (long)puVar12 * 8 + 0x2c0) = uVar2;
      uVar2 = *(undefined8 *)(A + uVar17 * 8 + 0x308);
      *(undefined8 *)(A + uVar17 * 8 + 0x308) = *(undefined8 *)(A + (long)puVar12 * 8 + 0x318);
      *(undefined8 *)(A + (long)puVar12 * 8 + 0x318) = uVar2;
      uVar2 = *(undefined8 *)(A + uVar17 * 8 + 0x360);
      *(undefined8 *)(A + uVar17 * 8 + 0x360) = *(undefined8 *)(A + (long)puVar12 * 8 + 0x370);
      *(undefined8 *)(A + (long)puVar12 * 8 + 0x370) = uVar2;
      lVar8 = (long)puVar12 * 0x58;
      uVar2 = *(undefined8 *)(A + lVar8);
      uVar5 = *(undefined8 *)(A + lVar8 + 8);
      uVar6 = *(undefined8 *)(pMVar14 + 8);
      *(undefined8 *)(A + lVar8) = *(undefined8 *)pMVar14;
      *(undefined8 *)(A + lVar8 + 8) = uVar6;
      *(undefined8 *)pMVar14 = uVar2;
      *(undefined8 *)(pMVar14 + 8) = uVar5;
      uVar2 = *(undefined8 *)(A + lVar8 + 0x10);
      uVar5 = *(undefined8 *)(A + lVar8 + 0x10 + 8);
      uVar6 = *(undefined8 *)(pMVar14 + 0x18);
      *(undefined8 *)(A + lVar8 + 0x10) = *(undefined8 *)(pMVar14 + 0x10);
      *(undefined8 *)(A + lVar8 + 0x10 + 8) = uVar6;
      *(undefined8 *)(pMVar14 + 0x10) = uVar2;
      *(undefined8 *)(pMVar14 + 0x18) = uVar5;
      uVar2 = *(undefined8 *)(A + lVar8 + 0x20);
      uVar5 = *(undefined8 *)(A + lVar8 + 0x20 + 8);
      uVar6 = *(undefined8 *)(pMVar14 + 0x28);
      *(undefined8 *)(A + lVar8 + 0x20) = *(undefined8 *)(pMVar14 + 0x20);
      *(undefined8 *)(A + lVar8 + 0x20 + 8) = uVar6;
      *(undefined8 *)(pMVar14 + 0x20) = uVar2;
      *(undefined8 *)(pMVar14 + 0x28) = uVar5;
      uVar2 = *(undefined8 *)(A + lVar8 + 0x30);
      uVar5 = *(undefined8 *)(A + lVar8 + 0x30 + 8);
      uVar6 = *(undefined8 *)(pMVar14 + 0x38);
      *(undefined8 *)(A + lVar8 + 0x30) = *(undefined8 *)(pMVar14 + 0x30);
      *(undefined8 *)(A + lVar8 + 0x30 + 8) = uVar6;
      *(undefined8 *)(pMVar14 + 0x30) = uVar2;
      *(undefined8 *)(pMVar14 + 0x38) = uVar5;
      uVar2 = *(undefined8 *)(A + lVar8 + 0x40);
      uVar5 = *(undefined8 *)(A + lVar8 + 0x40 + 8);
      uVar6 = *(undefined8 *)(pMVar14 + 0x48);
      *(undefined8 *)(A + lVar8 + 0x40) = *(undefined8 *)(pMVar14 + 0x40);
      *(undefined8 *)(A + lVar8 + 0x40 + 8) = uVar6;
      *(undefined8 *)(pMVar14 + 0x40) = uVar2;
      *(undefined8 *)(pMVar14 + 0x48) = uVar5;
      uVar2 = *(undefined8 *)(pMVar14 + 0x50);
      *(undefined8 *)(pMVar14 + 0x50) = *(undefined8 *)(A + lVar8 + 0x50);
      *(undefined8 *)(A + lVar8 + 0x50) = uVar2;
    }
    local_48 = *(double *)(pMVar14 + uVar19 * 8);
    local_f8 = (double *)0x0;
    dStack_f0 = 0.0;
    uStack_40 = 0;
    local_68 = uVar19;
    free((void *)0x0);
    pdVar9 = (double *)malloc(0x58);
    uVar13 = local_68;
    if (((ulong)pdVar9 & 0xf) != 0) {
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                    "void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (pdVar9 == (double *)0x0) {
      puVar11 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar11 = PyErr_Clear;
      __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    dStack_f0 = 5.43472210425371e-323;
    lVar8 = 0;
    pdVar10 = pdVar9;
    do {
      *pdVar10 = *(double *)(pMVar18 + lVar8 * 8);
      lVar8 = lVar8 + 0xb;
      pdVar10 = pdVar10 + 1;
    } while (lVar8 != 0x79);
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
    [8] = 0.0;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
    [9] = 0.0;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
    [6] = 0.0;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
    [7] = 0.0;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
    [4] = 0.0;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
    [5] = 0.0;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
    [2] = 0.0;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
    [3] = 0.0;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
    [0] = 0.0;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
    [1] = 0.0;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
    [10] = 0.0;
    local_58 = 1.0;
    local_e8.m_matrix = &local_c8;
    local_f8 = pdVar9;
    local_d8.m_matrix = (non_const_type)A;
    local_60 = puVar1;
    local_50.m_matrix.m_matrix = (non_const_type)(non_const_type)&local_f8;
    Eigen::internal::gemv_dense_selector<2,1,true>::
    run<Eigen::Transpose<Eigen::Matrix<double,11,11,0,11,11>const>,Eigen::Transpose<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>const>,Eigen::Transpose<Eigen::Matrix<double,1,11,1,1,11>>>
              (&local_d8,&local_50,&local_e8,&local_58);
    *(double *)(A + uVar17 * 8 + -0x10) =
         local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
         array[0];
    *(double *)(A + uVar17 * 8 + 0x48) =
         local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
         array[1];
    *(double *)(A + uVar17 * 8 + 0xa0) =
         local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
         array[2];
    *(double *)(A + uVar17 * 8 + 0xf8) =
         local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
         array[3];
    *(double *)(A + uVar17 * 8 + 0x150) =
         local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
         array[4];
    *(double *)(A + uVar17 * 8 + 0x1a8) =
         local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
         array[5];
    *(double *)(A + uVar17 * 8 + 0x200) =
         local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
         array[6];
    *(double *)(A + uVar17 * 8 + 600) =
         local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
         array[7];
    *(double *)(A + uVar17 * 8 + 0x2b0) =
         local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
         array[8];
    *(double *)(A + uVar17 * 8 + 0x308) =
         local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
         array[9];
    *(double *)(A + uVar17 * 8 + 0x360) =
         local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
         array[10];
    if ((long)dStack_f0 < 0) {
      __function = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
      ;
LAB_00160057:
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,__function);
    }
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
    [1] = dStack_f0;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
    [3] = -1.0;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
    [4] = (double)&local_f8;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_e8,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_c8);
    if ((long)local_e0 <= (long)local_60) {
LAB_00160023:
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                   );
    }
    ((local_e8.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.
    m_data.array[uVar17 - 2] = 1.0;
    uVar19 = local_e0 & 0x7ffffffffffffffe;
    if (1 < (long)local_e0) {
      uVar16 = 0;
      do {
        auVar23._8_4_ = SUB84(local_48,0);
        auVar23._0_8_ = local_48;
        auVar23._12_4_ = (int)((ulong)local_48 >> 0x20);
        auVar23 = divpd(*(undefined1 (*) [16])
                         (((local_e8.m_matrix)->
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.
                          m_data.array + uVar16),auVar23);
        *(undefined1 (*) [16])
         (((local_e8.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).
          m_storage.m_data.array + uVar16) = auVar23;
        uVar16 = uVar16 + 2;
      } while (uVar16 < uVar19);
    }
    if ((long)uVar19 < (long)local_e0) {
      do {
        ((local_e8.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).
        m_storage.m_data.array[uVar19] =
             ((local_e8.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).
             m_storage.m_data.array[uVar19] / local_48;
        uVar19 = uVar19 + 1;
      } while (local_e0 != uVar19);
    }
    if ((long)local_e0 <= (long)local_60) goto LAB_00160023;
    ((local_e8.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.
    m_data.array[uVar17 - 2] =
         ((local_e8.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).
         m_storage.m_data.array[uVar17 - 2] + -1.0;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
    [3] = 0.0;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
    [4] = (double)local_60;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
    [5] = 5.43472210425371e-323;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
    [0] = (double)pMVar14;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
    [2] = (double)A;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,11,11,0,11,11>,11,1,true>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_d8,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_11,_1,_true>_> *)
               &local_c8);
    uVar19 = local_d0;
    if ((long)local_d0 < 1) {
      uVar19 = 0;
    }
    uVar16 = 0;
    do {
      if (uVar19 == uVar16) goto LAB_00160023;
      if ((long)local_e0 < 0) {
        __function = 
        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, 1, -1>]"
        ;
        goto LAB_00160057;
      }
      if (local_e0 != 0xb) {
        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Block<Eigen::Matrix<double, 11, 11>, 1, 11>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 1, -1>>, const Eigen::Transpose<Eigen::Matrix<double, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Block<Eigen::Matrix<double, 11, 11>, 1, 11>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 1, -1>>, const Eigen::Transpose<Eigen::Matrix<double, -1, 1>>>]"
                     );
      }
      dVar22 = ((local_d8.m_matrix)->
               super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>).m_storage.m_data.
               array[uVar16];
      *(double *)(A + uVar16 * 8) =
           ((local_e8.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).
           m_storage.m_data.array[0] * dVar22 + *(double *)(A + uVar16 * 8);
      *(double *)(A + uVar16 * 8 + 0x58) =
           ((local_e8.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).
           m_storage.m_data.array[1] * dVar22 + *(double *)(A + uVar16 * 8 + 0x58);
      *(double *)(A + uVar16 * 8 + 0xb0) =
           ((local_e8.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).
           m_storage.m_data.array[2] * dVar22 + *(double *)(A + uVar16 * 8 + 0xb0);
      *(double *)(A + uVar16 * 8 + 0x108) =
           ((local_e8.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).
           m_storage.m_data.array[3] * dVar22 + *(double *)(A + uVar16 * 8 + 0x108);
      *(double *)(A + uVar16 * 8 + 0x160) =
           ((local_e8.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).
           m_storage.m_data.array[4] * dVar22 + *(double *)(A + uVar16 * 8 + 0x160);
      *(double *)(A + uVar16 * 8 + 0x1b8) =
           ((local_e8.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).
           m_storage.m_data.array[5] * dVar22 + *(double *)(A + uVar16 * 8 + 0x1b8);
      *(double *)(A + uVar16 * 8 + 0x210) =
           ((local_e8.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).
           m_storage.m_data.array[6] * dVar22 + *(double *)(A + uVar16 * 8 + 0x210);
      *(double *)(A + uVar16 * 8 + 0x268) =
           ((local_e8.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).
           m_storage.m_data.array[7] * dVar22 + *(double *)(A + uVar16 * 8 + 0x268);
      *(double *)(A + uVar16 * 8 + 0x2c0) =
           ((local_e8.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).
           m_storage.m_data.array[8] * dVar22 + *(double *)(A + uVar16 * 8 + 0x2c0);
      *(double *)(A + uVar16 * 8 + 0x318) =
           ((local_e8.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).
           m_storage.m_data.array[9] * dVar22 + *(double *)(A + uVar16 * 8 + 0x318);
      *(double *)(A + uVar16 * 8 + 0x370) =
           dVar22 * ((local_e8.m_matrix)->
                    super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data
                    .array[10] + *(double *)(A + uVar16 * 8 + 0x370);
      uVar16 = uVar16 + 1;
    } while (uVar17 != uVar16);
    *(undefined8 *)(A + uVar13 * 8) = 0;
    *(undefined8 *)(A + uVar13 * 8 + 0x58) = 0;
    *(undefined8 *)(A + uVar13 * 8 + 0xb0) = 0;
    *(undefined8 *)(A + uVar13 * 8 + 0x108) = 0;
    *(undefined8 *)(A + uVar13 * 8 + 0x160) = 0;
    *(undefined8 *)(A + uVar13 * 8 + 0x1b8) = 0;
    *(undefined8 *)(A + uVar13 * 8 + 0x210) = 0;
    *(undefined8 *)(A + uVar13 * 8 + 0x268) = 0;
    *(undefined8 *)(A + uVar13 * 8 + 0x2c0) = 0;
    *(undefined8 *)(A + uVar13 * 8 + 0x318) = 0;
    *(undefined8 *)(A + uVar13 * 8 + 0x370) = 0;
    *(undefined8 *)(pMVar14 + uVar13 * 8) = 0x3ff0000000000000;
    free(local_d8.m_matrix);
    free(local_e8.m_matrix);
    free(local_f8);
    uVar19 = uVar13 - 1;
    uVar15 = uVar15 - 1;
    uVar17 = uVar17 - 1;
    pMVar18 = pMVar18 + -8;
    if (uVar13 < 2) {
      local_70[0xb] = 1.0;
      lVar8 = 0x6e;
      do {
        *local_70 = -*(double *)(A + lVar8 * 8);
        local_70 = local_70 + 1;
        lVar8 = lVar8 + -0xb;
      } while (lVar8 != -0xb);
      return;
    }
  } while( true );
}

Assistant:

void charpoly_danilevsky_piv(Eigen::MatrixBase<Derived> &A, double *p) {
	int n = A.rows();

	for (int i = n - 1; i > 0; i--) {

		int piv_ind = i - 1;
		double piv = std::abs(A(i, i - 1));

		// Find largest pivot
		for (int j = 0; j < i - 1; j++) {
			if (std::abs(A(i, j)) > piv) {
				piv = std::abs(A(i, j));
				piv_ind = j;
			}
		}
		if (piv_ind != i - 1) {
			// Perform permutation
			A.row(i - 1).swap(A.row(piv_ind));
			A.col(i - 1).swap(A.col(piv_ind));
		}
		piv = A(i, i - 1);

		Eigen::VectorXd v = A.row(i);
		A.row(i - 1) = v.transpose()*A;

		Eigen::VectorXd vinv = (-1.0)*v;
		vinv(i - 1) = 1;
		vinv /= piv;
		vinv(i - 1) -= 1;
		Eigen::VectorXd Acol = A.col(i - 1);
		for (int j = 0; j <= i; j++)
			A.row(j) = A.row(j) + Acol(j)*vinv.transpose();


		A.row(i) = Eigen::VectorXd::Zero(n);
		A(i, i - 1) = 1;
	}
	p[n] = 1;
	for (int i = 0; i < n; i++)
		p[i] = -A(0, n - i - 1);
}